

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.hpp
# Opt level: O0

string * __thiscall
Kandinsky::VariableExpression::toString_abi_cxx11_(VariableExpression *this,bool evaluate)

{
  byte in_DL;
  double in_RSI;
  string *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  
  if ((in_DL & 1) == 0) {
    std::__cxx11::string::string(in_RDI,(string *)((long)in_RSI + 0x10));
  }
  else {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
    ::operator()((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
                  *)(CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff),in_RSI);
  }
  return in_RDI;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return evaluate ? m_formatter(m_value) : m_name;
        }